

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::restart_election_timer(raft_server *this)

{
  ptr<delayed_task> *this_00;
  long *plVar1;
  element_type *peVar2;
  int iVar3;
  string local_50;
  undefined4 local_2c;
  unique_lock<std::recursive_mutex> guard;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
  if ((((this->catching_up_)._M_base._M_i & 1U) == 0) && ((this->role_)._M_i != leader)) {
    if (((((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->election_timer_allowed_)._M_base._M_i & 1U) == 0) {
      LOCK();
      (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      election_timer_allowed_)._M_base._M_i = true;
      UNLOCK();
      plVar1 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                            .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar1 + 0x20))
                (plVar1,(this->state_).
                        super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    this_00 = &this->election_task_;
    if ((this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      local_2c = 1;
      std::make_shared<nuraft::timer_task<void>,std::function<void()>&,nuraft::timer_task_type>
                ((function<void_()> *)&local_50,(timer_task_type *)&this->election_exec_);
      std::__shared_ptr<nuraft::delayed_task,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<nuraft::delayed_task,(__gnu_cxx::_Lock_policy)2> *)this_00,
                 (__shared_ptr<nuraft::timer_task<void>,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
    }
    else {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar3 = (*peVar2->_vptr_logger[7])();
        if (5 < iVar3) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_(&local_50,"cancel existing timer");
          (*peVar2->_vptr_logger[8])
                    (peVar2,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"restart_election_timer",0xb0,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      cancel_task(this,this_00);
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      iVar3 = (*peVar2->_vptr_logger[7])();
      if (5 < iVar3) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_50,"re-schedule election timer");
        (*peVar2->_vptr_logger[8])
                  (peVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                   ,"restart_election_timer",0xb8,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    timer_helper::reset(&this->last_election_timer_reset_);
    iVar3 = std::function<int_()>::operator()(&this->rand_timeout_);
    schedule_task(this,this_00,iVar3);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void raft_server::restart_election_timer() {
    // don't start the election timer while this server is still catching up the logs
    // or this server is the leader
    recur_lock(lock_);
    if (catching_up_ || role_ == srv_role::leader) {
        return;
    }

    // If election timer was not allowed, clear the flag.
    if (!state_->is_election_timer_allowed()) {
        state_->allow_election_timer(true);
        ctx_->state_mgr_->save_state(*state_);
    }

    if (election_task_) {
        p_tr("cancel existing timer");
        cancel_task(election_task_);
    } else {
        election_task_ = cs_new< timer_task<void> >
                               ( election_exec_,
                                 timer_task_type::election_timer );
    }

    p_tr("re-schedule election timer");
    last_election_timer_reset_.reset();

    schedule_task(election_task_, rand_timeout_());
}